

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

double __thiscall FixedSizeCache<double>::min(FixedSizeCache<double> *this)

{
  bool bVar1;
  runtime_error *this_00;
  reference pdVar2;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  double *local_38;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_30;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_28 [3];
  FixedSizeCache<double> *local_10;
  FixedSizeCache<double> *this_local;
  
  local_10 = this;
  bVar1 = empty(this);
  if (!bVar1) {
    local_30._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(&this->_data);
    local_40._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(&this->_data);
    local_38 = (double *)
               __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator+(&local_40,(long)this->_count);
    local_28[0] = std::
                  min_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                            (local_30,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                       )local_38);
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(local_28);
    return *pdVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"FixedSizeCache::min() called on empty cache");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T
    min() const
    {
        if (this->empty()) throw std::runtime_error("FixedSizeCache::min() called on empty cache");
        return *std::min_element(this->_data.begin(), this->_data.begin() + this->_count);
    }